

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool google::protobuf::TextFormat::PrintUnknownFieldsToString
               (UnknownFieldSet *unknown_fields,string *output)

{
  bool bVar1;
  Printer *this;
  Printer *in_stack_ffffffffffffff70;
  _Base_ptr in_stack_ffffffffffffffd0;
  _Base_ptr in_stack_ffffffffffffffd8;
  Printer *in_stack_ffffffffffffffe0;
  
  this = (Printer *)&stack0xffffffffffffff68;
  Printer::Printer(in_stack_ffffffffffffff70);
  bVar1 = Printer::PrintUnknownFieldsToString
                    (in_stack_ffffffffffffffe0,(UnknownFieldSet *)in_stack_ffffffffffffffd8,
                     (string *)in_stack_ffffffffffffffd0);
  Printer::~Printer(this);
  return bVar1;
}

Assistant:

bool TextFormat::PrintUnknownFieldsToString(
    const UnknownFieldSet& unknown_fields, std::string* output) {
  return Printer().PrintUnknownFieldsToString(unknown_fields, output);
}